

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_auth_login_password_resp(connectdata *conn,int smtpcode,smtpstate instate)

{
  char *local_38;
  char *authpasswd;
  size_t len;
  SessionHandle *data;
  smtpstate local_18;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  connectdata *conn_local;
  
  data._4_4_ = 0;
  len = (size_t)conn->data;
  authpasswd = (char *)0x0;
  local_38 = (char *)0x0;
  local_18 = instate;
  result = smtpcode;
  _instate_local = conn;
  if (smtpcode == 0x14e) {
    data._4_4_ = Curl_sasl_create_login_message
                           (conn->data,conn->passwd,&local_38,(size_t *)&authpasswd);
    if (((data._4_4_ == CURLE_OK) && (local_38 != (char *)0x0)) &&
       (data._4_4_ = Curl_pp_sendf(&(_instate_local->proto).ftpc.pp,"%s",local_38),
       data._4_4_ == CURLE_OK)) {
      state(_instate_local,SMTP_AUTH_FINAL);
    }
  }
  else {
    Curl_failf((SessionHandle *)len,"Access denied: %d",(ulong)(uint)smtpcode);
    data._4_4_ = CURLE_LOGIN_DENIED;
  }
  if (local_38 != (char *)0x0) {
    (*Curl_cfree)(local_38);
  }
  return data._4_4_;
}

Assistant:

static CURLcode smtp_state_auth_login_password_resp(struct connectdata *conn,
                                                    int smtpcode,
                                                    smtpstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  size_t len = 0;
  char *authpasswd = NULL;

  (void)instate; /* no use for this yet */

  if(smtpcode != 334) {
    failf(data, "Access denied: %d", smtpcode);
    result = CURLE_LOGIN_DENIED;
  }
  else {
    /* Create the password message */
    result = Curl_sasl_create_login_message(conn->data, conn->passwd,
                                            &authpasswd, &len);
    if(!result && authpasswd) {
      /* Send the password */
      result = Curl_pp_sendf(&conn->proto.smtpc.pp, "%s", authpasswd);

      if(!result)
        state(conn, SMTP_AUTH_FINAL);
    }
  }

  Curl_safefree(authpasswd);

  return result;
}